

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_def.c
# Opt level: O0

FORM * new_form(FIELD **fields)

{
  int *piVar1;
  undefined8 local_20;
  FORM *form;
  int err;
  FIELD **fields_local;
  
  form._4_4_ = -1;
  local_20 = (FORM *)malloc(0x80);
  if (local_20 != (FORM *)0x0) {
    memcpy(local_20,_nc_Default_Form,0x80);
    form._4_4_ = Associate_Fields(local_20,fields);
    if (form._4_4_ != 0) {
      free_form(local_20);
      local_20 = (FORM *)0x0;
    }
  }
  if (local_20 == (FORM *)0x0) {
    piVar1 = __errno_location();
    *piVar1 = form._4_4_;
  }
  return local_20;
}

Assistant:

FORM *new_form(FIELD ** fields)
{	
  int err = E_SYSTEM_ERROR;

  FORM *form = (FORM *)malloc(sizeof(FORM));
  
  if (form)
    {
      *form = *_nc_Default_Form;
      if ((err=Associate_Fields(form,fields))!=E_OK)
	{
	  free_form(form);
	  form = (FORM *)0;
	}
    }

  if (!form)
    SET_ERROR(err);
  
  return(form);
}